

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

void __thiscall
pbrt::KdTreeAggregate::buildTree
          (KdTreeAggregate *this,int nodeNum,Bounds3f *nodeBounds,
          vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *allPrimBounds,
          int *primNums,int nPrimitives,int depth,
          unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *edges,int *prims0,
          int *prims1,int badRefines)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  pointer pBVar5;
  float fVar6;
  anon_union_4_3_69f49728_for_KdTreeNode_0 aVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  float fVar12;
  KdTreeNode *__src;
  pointer pBVar13;
  BoundEdge *pBVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  float fVar17;
  float fVar18;
  uint uVar19;
  KdTreeNode *pKVar20;
  EdgeType *pEVar21;
  long lVar22;
  Bounds3f *pBVar23;
  Point3<float> *pPVar24;
  int iVar25;
  int iVar26;
  int *piVar27;
  int iVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  long lVar34;
  int iVar35;
  pointer pBVar36;
  long lVar37;
  int *piVar38;
  BoundEdge *__i;
  BoundEdge *pBVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  uint uVar55;
  undefined1 auVar56 [64];
  undefined1 in_XMM20 [16];
  uint local_154;
  ulong local_e8;
  Bounds3f bounds1;
  Bounds3f bounds0;
  
  bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)nodeNum;
  fVar12 = (float)this->nextFreeNode;
  bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar12;
  if (fVar12 != (float)nodeNum) {
    LogFatal<char_const(&)[8],char_const(&)[13],char_const(&)[8],int&,char_const(&)[13],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
               ,0x365,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [8])"nodeNum",
               (char (*) [13])"nextFreeNode",(char (*) [8])"nodeNum",(int *)&bounds0,
               (char (*) [13])"nextFreeNode",(int *)&bounds1);
  }
  fVar48 = (float)this->nAllocedNodes;
  if (fVar12 == fVar48) {
    uVar31 = 0x200;
    if (0x200 < (int)fVar48 * 2) {
      uVar31 = (ulong)(uint)((int)fVar48 * 2);
    }
    pKVar20 = (KdTreeNode *)operator_new__(uVar31 * 8);
    if (0 < (int)fVar48) {
      __src = this->nodes;
      memcpy(pKVar20,__src,(ulong)(uint)fVar48 << 3);
      if (__src != (KdTreeNode *)0x0) {
        operator_delete__(__src);
      }
    }
    this->nodes = pKVar20;
    this->nAllocedNodes = (int)uVar31;
  }
  this->nextFreeNode = this->nextFreeNode + 1;
  if ((depth != 0) && (this->maxPrims < nPrimitives)) {
    fVar48 = (float)(this->isectCost * nPrimitives);
    fVar12 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.x -
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
    pfVar1 = &(nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
    pfVar2 = &(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
    pfVar3 = &(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
    uVar8 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
    uVar10 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
    auVar46._4_4_ = uVar10;
    auVar46._0_4_ = uVar8;
    auVar46._8_8_ = 0;
    uVar9 = (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
    uVar11 = (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
    auVar47._4_4_ = uVar11;
    auVar47._0_4_ = uVar9;
    auVar47._8_8_ = 0;
    auVar47 = vsubps_avx(auVar46,auVar47);
    auVar46 = vmovshdup_avx(auVar47);
    auVar45 = ZEXT416((uint)fVar12);
    auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * auVar46._0_4_)),auVar47,auVar45);
    auVar41 = vfmadd231ss_fma(auVar41,auVar47,auVar46);
    auVar41 = vdivss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)(auVar41._0_4_ + auVar41._0_4_)));
    auVar56 = ZEXT1664(auVar41);
    uVar31 = vcmpps_avx512vl(auVar47,auVar45,1);
    uVar29 = vcmpps_avx512vl(auVar46,auVar45,1);
    iVar26 = 0;
    uVar32 = (ulong)((auVar47._0_4_ <= auVar46._0_4_) + 1);
    if ((uVar31 & uVar29 & 1) != 0) {
      uVar32 = 0;
    }
    uVar19 = nPrimitives * 2;
    pfVar4 = &(nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
    uVar31 = 1;
    if (1 < (int)uVar19) {
      uVar31 = (ulong)uVar19;
    }
    local_e8 = 0xffffffff;
    local_154 = 0xffffffff;
    uVar55 = auVar41._0_4_;
    do {
      uVar30 = (uint)uVar32;
      if (0 < nPrimitives) {
        pBVar13 = (allPrimBounds->
                  super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pEVar21 = &edges[uVar32]._M_t.
                   super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                   .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl[1].type;
        uVar29 = 0;
        do {
          iVar28 = primNums[uVar29];
          pBVar5 = pBVar13 + iVar28;
          pBVar36 = pBVar5;
          if (uVar30 != 0) {
            if (uVar30 == 1) {
              pBVar36 = (pointer)&(pBVar5->pMin).super_Tuple3<pbrt::Point3,_float>.y;
            }
            else {
              pBVar36 = (pointer)&(pBVar5->pMin).super_Tuple3<pbrt::Point3,_float>.z;
            }
          }
          pEVar21[-5] = (EdgeType)(pBVar36->pMin).super_Tuple3<pbrt::Point3,_float>.x;
          pEVar21[-4] = iVar28;
          pEVar21[-3] = 0;
          if (uVar30 == 0) {
            pPVar24 = &pBVar5->pMax;
          }
          else if (uVar30 == 1) {
            pPVar24 = (Point3<float> *)&(pBVar5->pMax).super_Tuple3<pbrt::Point3,_float>.y;
          }
          else {
            pPVar24 = (Point3<float> *)&(pBVar5->pMax).super_Tuple3<pbrt::Point3,_float>.z;
          }
          ((BoundEdge *)(pEVar21 + -2))->t = (pPVar24->super_Tuple3<pbrt::Point3,_float>).x;
          pEVar21[-1] = iVar28;
          *pEVar21 = End;
          uVar29 = uVar29 + 1;
          pEVar21 = pEVar21 + 6;
        } while ((uint)nPrimitives != uVar29);
      }
      if (nPrimitives != 0) {
        pBVar14 = edges[uVar32]._M_t.
                  super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                  .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
        std::
        __introsort_loop<pbrt::BoundEdge*,long,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                  (pBVar14,pBVar14 + (int)uVar19,(int)LZCOUNT((long)(int)uVar19) * 2 ^ 0x7e);
        if (nPrimitives < 9) {
          std::
          __insertion_sort<pbrt::BoundEdge*,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                    ();
          auVar56 = ZEXT464(uVar55);
        }
        else {
          pBVar39 = pBVar14 + 0x10;
          std::
          __insertion_sort<pbrt::BoundEdge*,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                    ();
          piVar38 = &pBVar14[0x10].primNum;
          auVar56 = ZEXT464(uVar55);
          do {
            fVar12 = pBVar39->t;
            uVar15._0_4_ = pBVar39->primNum;
            uVar15._4_4_ = pBVar39->type;
            for (piVar27 = piVar38;
                (fVar12 < (float)piVar27[-4] ||
                ((fVar12 <= (float)piVar27[-4] && ((int)uVar15._4_4_ < piVar27[-2]))));
                piVar27 = piVar27 + -3) {
              piVar27[1] = piVar27[-2];
              uVar16 = *(undefined8 *)(piVar27 + -4);
              ((BoundEdge *)(piVar27 + -1))->t = (Float)(int)uVar16;
              ((BoundEdge *)(piVar27 + -1))->primNum = (int)((ulong)uVar16 >> 0x20);
            }
            ((BoundEdge *)(piVar27 + -1))->t = fVar12;
            *(undefined8 *)piVar27 = uVar15;
            pBVar39 = pBVar39 + 1;
            piVar38 = piVar38 + 3;
          } while (pBVar39 != pBVar14 + (int)uVar19);
        }
      }
      iVar28 = nPrimitives;
      if (nPrimitives < 1) {
        iVar35 = 0;
      }
      else {
        fVar12 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.x -
                 (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
        fVar17 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y -
                 (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
        fVar18 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z -
                 (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
        iVar25 = uVar30 + 1 + ((uVar30 + 1) / 3) * -3;
        iVar33 = uVar30 + 2 + ((uVar30 + 2) / 3) * -3;
        auVar41 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)this->emptyBonus));
        auVar46 = vcvtsi2ss_avx512f(in_XMM20,this->traversalCost);
        auVar47 = vcvtsi2ss_avx512f(in_XMM20,this->isectCost);
        pEVar21 = &(edges[uVar32]._M_t.
                    super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                    .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl)->type;
        uVar29 = 0;
        iVar35 = 0;
        do {
          pBVar23 = nodeBounds;
          if ((uVar30 != 0) && (pBVar23 = (Bounds3f *)pfVar2, uVar30 != 1)) {
            pBVar23 = (Bounds3f *)pfVar3;
          }
          iVar28 = iVar28 - (uint)(*pEVar21 == End);
          fVar6 = ((BoundEdge *)(pEVar21 + -2))->t;
          if ((pBVar23->pMin).super_Tuple3<pbrt::Point3,_float>.x < fVar6) {
            pPVar24 = &nodeBounds->pMax;
            if ((uVar30 != 0) && (pPVar24 = (Point3<float> *)pfVar1, uVar30 != 1)) {
              pPVar24 = (Point3<float> *)pfVar4;
            }
            if (fVar6 < (pPVar24->super_Tuple3<pbrt::Point3,_float>).x) {
              auVar42 = ZEXT416((uint)fVar17);
              auVar43 = ZEXT416((uint)fVar18);
              auVar45 = ZEXT416((uint)fVar12);
              if ((iVar25 != 0) && (auVar45 = auVar42, iVar25 != 1)) {
                auVar45 = auVar43;
              }
              auVar44 = ZEXT416((uint)fVar12);
              if ((iVar33 != 0) && (auVar44 = auVar42, iVar33 != 1)) {
                auVar44 = auVar43;
              }
              pBVar23 = nodeBounds;
              if ((uVar30 != 0) && (pBVar23 = (Bounds3f *)pfVar2, uVar30 != 1)) {
                pBVar23 = (Bounds3f *)pfVar3;
              }
              fVar49 = fVar12;
              if ((iVar25 != 0) && (fVar49 = fVar17, iVar25 != 1)) {
                fVar49 = fVar18;
              }
              fVar50 = fVar12;
              if ((iVar33 != 0) && (fVar50 = fVar17, iVar33 != 1)) {
                fVar50 = fVar18;
              }
              auVar51 = ZEXT416((uint)fVar12);
              if ((iVar25 != 0) && (auVar51 = auVar42, iVar25 != 1)) {
                auVar51 = auVar43;
              }
              auVar52 = ZEXT416((uint)fVar12);
              if ((iVar33 != 0) && (auVar52 = auVar42, iVar33 != 1)) {
                auVar52 = auVar43;
              }
              pPVar24 = &nodeBounds->pMax;
              if ((uVar30 != 0) && (pPVar24 = (Point3<float> *)pfVar1, uVar30 != 1)) {
                pPVar24 = (Point3<float> *)pfVar4;
              }
              auVar53 = ZEXT416((uint)fVar12);
              if ((iVar25 != 0) && (auVar53 = auVar42, iVar25 != 1)) {
                auVar53 = auVar43;
              }
              auVar54 = ZEXT416((uint)fVar12);
              if ((iVar33 != 0) && (auVar54 = auVar42, iVar33 != 1)) {
                auVar54 = auVar43;
              }
              auVar42 = vaddss_avx512f(auVar53,auVar54);
              auVar45 = vfmadd213ss_fma(auVar44,auVar45,
                                        ZEXT416((uint)((fVar6 - (pBVar23->pMin).
                                                                super_Tuple3<pbrt::Point3,_float>.x)
                                                      * (fVar49 + fVar50))));
              auVar42 = vfmadd213ss_fma(auVar52,auVar51,
                                        ZEXT416((uint)(auVar42._0_4_ *
                                                      ((pPVar24->super_Tuple3<pbrt::Point3,_float>).
                                                       x - fVar6))));
              auVar43 = vmulss_avx512f(auVar56._0_16_,ZEXT416((uint)(auVar45._0_4_ + auVar45._0_4_))
                                      );
              auVar44 = vmulss_avx512f(auVar56._0_16_,ZEXT416((uint)(auVar42._0_4_ + auVar42._0_4_))
                                      );
              bVar40 = iVar35 == 0;
              auVar45 = vcvtsi2ss_avx512f(in_XMM20,iVar35);
              auVar42 = vcvtsi2ss_avx512f(in_XMM20,iVar28);
              auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * auVar44._0_4_)),auVar43,
                                        auVar45);
              auVar42 = vfmadd213ss_fma(auVar45,ZEXT416((uint)((float)((uint)(iVar28 == 0) *
                                                                       auVar41._0_4_ +
                                                                      (uint)(iVar28 != 0) *
                                                                      ((uint)bVar40 * auVar41._0_4_
                                                                      + (uint)!bVar40 * 0x3f800000))
                                                              * auVar47._0_4_)),auVar46);
              auVar45 = vucomiss_avx512f(auVar42);
              vminss_avx512f(auVar42,auVar45);
              if (!bVar40) {
                local_e8 = uVar29;
              }
              local_e8 = local_e8 & 0xffffffff;
              if (!bVar40) {
                local_154 = uVar30;
              }
            }
          }
          iVar35 = iVar35 + (uint)(*pEVar21 == Start);
          uVar29 = uVar29 + 1;
          pEVar21 = pEVar21 + 3;
        } while (uVar31 != uVar29);
      }
      if ((iVar35 != nPrimitives) || (iVar28 != 0)) {
        LogFatal<char_const(&)[37]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                   ,0x3b1,"Check failed: %s",(char (*) [37])"nBelow == nPrimitives && nAbove == 0");
      }
      bVar40 = iVar26 < 2;
      if (bVar40 && local_154 == 0xffffffff) {
        iVar26 = iVar26 + 1;
        uVar32 = (ulong)((uVar30 + 1) % 3);
      }
      else {
        vucomiss_avx512f(ZEXT416((uint)fVar48));
        vucomiss_avx512f(ZEXT416((uint)(fVar48 * 4.0)));
        if (((nPrimitives < 0x10 && badRefines != 0) || (local_154 == 0xffffffff)) ||
           (badRefines == 3)) {
          KdTreeNode::InitLeaf(this->nodes + nodeNum,primNums,nPrimitives,&this->primitiveIndices);
          auVar56 = ZEXT464(uVar55);
        }
        else {
          iVar28 = 0;
          lVar22 = (long)(int)local_154;
          iVar35 = 0;
          iVar25 = (int)local_e8;
          if (0 < iVar25) {
            pBVar14 = edges[lVar22]._M_t.
                      super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                      .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
            lVar34 = 0;
            iVar35 = 0;
            do {
              if (*(int *)((long)&pBVar14->type + lVar34) == 0) {
                lVar37 = (long)iVar35;
                iVar35 = iVar35 + 1;
                prims0[lVar37] = *(int *)((long)&pBVar14->primNum + lVar34);
              }
              lVar34 = lVar34 + 0xc;
            } while (local_e8 * 0xc != lVar34);
          }
          if (iVar25 + 1 < (int)uVar19) {
            pEVar21 = &edges[lVar22]._M_t.
                       super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                       .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl[iVar25 + 1].
                       type;
            iVar33 = nPrimitives * -2 + 1 + iVar25;
            iVar28 = 0;
            do {
              if (*pEVar21 == End) {
                lVar34 = (long)iVar28;
                iVar28 = iVar28 + 1;
                prims1[lVar34] = pEVar21[-1];
              }
              pEVar21 = pEVar21 + 3;
              iVar33 = iVar33 + 1;
            } while (iVar33 != 0);
          }
          aVar7 = *(anon_union_4_3_69f49728_for_KdTreeNode_0 *)
                   (edges[lVar22]._M_t.
                    super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                    .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl + iVar25);
          bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.y =
               (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
          bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.z =
               (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
          bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.x =
               (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
          bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.y =
               (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
          bounds0._8_8_ = *(undefined8 *)&(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
          bounds1.pMax.super_Tuple3<pbrt::Point3,_float>.y =
               (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
          bounds1.pMax.super_Tuple3<pbrt::Point3,_float>.z =
               (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x =
               (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.y =
               (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
          bounds1._8_8_ = *(undefined8 *)&(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
          pBVar23 = &bounds1;
          if ((local_154 != 0) &&
             (pBVar23 = (Bounds3f *)&bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.y,
             local_154 != 1)) {
            pBVar23 = (Bounds3f *)&bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.z;
          }
          (pBVar23->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)aVar7;
          pPVar24 = &bounds0.pMax;
          if ((local_154 != 0) &&
             (pPVar24 = (Point3<float> *)&bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.y,
             local_154 != 1)) {
            pPVar24 = (Point3<float> *)&bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.z;
          }
          (pPVar24->super_Tuple3<pbrt::Point3,_float>).x = (float)aVar7;
          buildTree(this,nodeNum + 1,&bounds0,allPrimBounds,prims0,iVar35,depth + -1,edges,prims0,
                    prims1 + nPrimitives,badRefines);
          iVar35 = this->nextFreeNode;
          pKVar20 = this->nodes;
          pKVar20[nodeNum].field_0 = aVar7;
          pKVar20[nodeNum].field_1.flags = iVar35 * 4 | local_154;
          buildTree(this,iVar35,&bounds1,allPrimBounds,prims1,iVar28,depth + -1,edges,prims0,
                    prims1 + nPrimitives,badRefines);
          auVar56 = ZEXT464(uVar55);
        }
      }
    } while (bVar40 && local_154 == 0xffffffff);
    return;
  }
  KdTreeNode::InitLeaf(this->nodes + nodeNum,primNums,nPrimitives,&this->primitiveIndices);
  return;
}

Assistant:

void KdTreeAggregate::buildTree(int nodeNum, const Bounds3f &nodeBounds,
                                const std::vector<Bounds3f> &allPrimBounds, int *primNums,
                                int nPrimitives, int depth,
                                const std::unique_ptr<BoundEdge[]> edges[3], int *prims0,
                                int *prims1, int badRefines) {
    CHECK_EQ(nodeNum, nextFreeNode);
    // Get next free node from _nodes_ array
    if (nextFreeNode == nAllocedNodes) {
        int nNewAllocNodes = std::max(2 * nAllocedNodes, 512);
        KdTreeNode *n = new KdTreeNode[nNewAllocNodes];
        if (nAllocedNodes > 0) {
            memcpy(n, nodes, nAllocedNodes * sizeof(KdTreeNode));
            delete[] nodes;
        }
        nodes = n;
        nAllocedNodes = nNewAllocNodes;
    }
    ++nextFreeNode;

    // Initialize leaf node if termination criteria met
    if (nPrimitives <= maxPrims || depth == 0) {
        nodes[nodeNum].InitLeaf(primNums, nPrimitives, &primitiveIndices);
        return;
    }

    // Initialize interior node and continue recursion
    // Choose split axis position for interior node
    int bestAxis = -1, bestOffset = -1;
    Float bestCost = Infinity, leafCost = isectCost * nPrimitives;
    Float invTotalSA = 1 / nodeBounds.SurfaceArea();
    // Choose which axis to split along
    int axis = nodeBounds.MaxDimension();

    // Choose split along axis and attempt to partition primitives
    int retries = 0;
retrySplit:
    // Initialize edges for _axis_
    for (int i = 0; i < nPrimitives; ++i) {
        int pn = primNums[i];
        const Bounds3f &bounds = allPrimBounds[pn];
        edges[axis][2 * i] = BoundEdge(bounds.pMin[axis], pn, true);
        edges[axis][2 * i + 1] = BoundEdge(bounds.pMax[axis], pn, false);
    }
    // Sort _edges_ for _axis_
    std::sort(&edges[axis][0], &edges[axis][2 * nPrimitives],
              [](const BoundEdge &e0, const BoundEdge &e1) -> bool {
                  return std::tie(e0.t, e0.type) < std::tie(e1.t, e1.type);
              });

    // Compute cost of all splits for _axis_ to find best
    int nBelow = 0, nAbove = nPrimitives;
    for (int i = 0; i < 2 * nPrimitives; ++i) {
        if (edges[axis][i].type == EdgeType::End)
            --nAbove;
        Float edgeT = edges[axis][i].t;
        if (edgeT > nodeBounds.pMin[axis] && edgeT < nodeBounds.pMax[axis]) {
            // Compute child surface areas for split at _edgeT_
            Vector3f d = nodeBounds.pMax - nodeBounds.pMin;
            int otherAxis0 = (axis + 1) % 3, otherAxis1 = (axis + 2) % 3;
            Float belowSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (edgeT - nodeBounds.pMin[axis]) * (d[otherAxis0] + d[otherAxis1]));
            Float aboveSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (nodeBounds.pMax[axis] - edgeT) * (d[otherAxis0] + d[otherAxis1]));

            // Compute cost for split at _i_th edge
            Float pBelow = belowSA * invTotalSA, pAbove = aboveSA * invTotalSA;
            Float eb = (nAbove == 0 || nBelow == 0) ? emptyBonus : 0;
            Float cost = traversalCost +
                         isectCost * (1 - eb) * (pBelow * nBelow + pAbove * nAbove);
            // Update best split if this is lowest cost so far
            if (cost < bestCost) {
                bestCost = cost;
                bestAxis = axis;
                bestOffset = i;
            }
        }
        if (edges[axis][i].type == EdgeType::Start)
            ++nBelow;
    }
    CHECK(nBelow == nPrimitives && nAbove == 0);

    // Create leaf if no good splits were found
    if (bestAxis == -1 && retries < 2) {
        ++retries;
        axis = (axis + 1) % 3;
        goto retrySplit;
    }
    if (bestCost > leafCost)
        ++badRefines;
    if ((bestCost > 4 * leafCost && nPrimitives < 16) || bestAxis == -1 ||
        badRefines == 3) {
        nodes[nodeNum].InitLeaf(primNums, nPrimitives, &primitiveIndices);
        return;
    }

    // Classify primitives with respect to split
    int n0 = 0, n1 = 0;
    for (int i = 0; i < bestOffset; ++i)
        if (edges[bestAxis][i].type == EdgeType::Start)
            prims0[n0++] = edges[bestAxis][i].primNum;
    for (int i = bestOffset + 1; i < 2 * nPrimitives; ++i)
        if (edges[bestAxis][i].type == EdgeType::End)
            prims1[n1++] = edges[bestAxis][i].primNum;

    // Recursively initialize children nodes
    Float tSplit = edges[bestAxis][bestOffset].t;
    Bounds3f bounds0 = nodeBounds, bounds1 = nodeBounds;
    bounds0.pMax[bestAxis] = bounds1.pMin[bestAxis] = tSplit;
    buildTree(nodeNum + 1, bounds0, allPrimBounds, prims0, n0, depth - 1, edges, prims0,
              prims1 + nPrimitives, badRefines);
    int aboveChild = nextFreeNode;
    nodes[nodeNum].InitInterior(bestAxis, aboveChild, tSplit);
    buildTree(aboveChild, bounds1, allPrimBounds, prims1, n1, depth - 1, edges, prims0,
              prims1 + nPrimitives, badRefines);
}